

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

string * __thiscall
pbrt::MLTSampler::DumpState_abi_cxx11_(string *__return_storage_ptr__,MLTSampler *this)

{
  size_t sVar1;
  long lVar2;
  PrimarySample *v;
  string ret;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = (this->X).nStored;
  if (sVar1 != 0) {
    v = (this->X).ptr;
    lVar2 = sVar1 << 5;
    do {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      detail::stringPrintfRecursive<float_const&>(&local_50,"%f,",&v->value);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      v = v + 1;
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != 0);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string MLTSampler::DumpState() const {
    std::string state;
    for (const PrimarySample &Xi : X)
        state += StringPrintf("%f,", Xi.value);
    state += "0";
    return state;
}